

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

Value * __thiscall
anon_unknown.dwarf_1a3a51f::Target::Dump(Value *__return_storage_ptr__,Target *this)

{
  ulong *puVar1;
  _Link_type __k;
  size_type *psVar2;
  size_t *psVar3;
  vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
  *pvVar4;
  vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
  *this_00;
  pointer *pppcVar5;
  Comments *pCVar6;
  mapped_type_conflict2 mVar7;
  cmMakefile *pcVar8;
  cmInstallTargetGenerator *this_01;
  void *pvVar9;
  size_type sVar10;
  pointer pSVar11;
  pointer pSVar12;
  __node_type *p_Var13;
  long *plVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  pointer pJVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  _Alloc_hider _Var19;
  pointer pIVar20;
  pointer ppcVar21;
  pointer pbVar22;
  pointer puVar23;
  bool bVar24;
  TargetType targetType;
  JBTIndex JVar27;
  ArrayIndex si;
  JBTIndex *__cur;
  TargetType TVar25;
  int iVar26;
  string *psVar28;
  Value *pVVar29;
  cmLocalGenerator *pcVar30;
  string *psVar31;
  vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> *__x;
  OutputInfo *pOVar32;
  undefined8 *puVar33;
  cmValue cVar34;
  cmGlobalGenerator *this_02;
  TargetDependSet *pTVar35;
  _Base_ptr p_Var36;
  iterator iVar37;
  _Base_ptr p_Var38;
  _Rb_tree_node_base *p_Var39;
  iterator iVar40;
  byte extraout_var;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar41;
  pointer pJVar42;
  ulong uVar43;
  pointer pJVar44;
  undefined8 uVar45;
  cmFileSet *this_03;
  mapped_type_conflict2 *pmVar46;
  KindedSources *pKVar47;
  pointer pJVar48;
  _Base_ptr __dest;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar49;
  Value *extraout_RAX;
  cmListFileBacktrace *pcVar50;
  ulong uVar51;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar52;
  long lVar53;
  JBTIndex bt;
  JBTIndex bt_00;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *extraout_RDX_01;
  string *extraout_RDX_02;
  size_t __n;
  IncludeEntry *extraout_RDX_03;
  IncludeEntry *extraout_RDX_04;
  IncludeEntry *extraout_RDX_05;
  IncludeEntry *pIVar54;
  IncludeEntry *extraout_RDX_06;
  pointer ppcVar55;
  _Rb_tree_header *p_Var56;
  _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
  *p_Var57;
  pointer sk;
  pointer value;
  pointer pJVar58;
  pointer pCVar59;
  _Base_ptr p_Var60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar61;
  _Link_type __p;
  _Rb_tree_node_base *__x_00;
  cmListFileBacktrace *__n_00;
  pointer pcVar62;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var63;
  __uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  _Var64;
  BacktraceData *this_04;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *bt_01;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar65;
  cmListFileBacktrace *bt_02;
  pointer in;
  pointer cge;
  pointer pJVar66;
  ulong uVar67;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar68;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar69;
  JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pJVar70;
  Target *pTVar71;
  __node_base _Var72;
  ValueHolder VVar73;
  pointer pJVar74;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar75;
  static_string_view sVar76;
  pointer local_378;
  pointer local_368;
  string p;
  size_type __dnew;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  _Alloc_hider local_2f8;
  Value artifact;
  undefined1 local_2c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  __node_base local_290;
  _Base_ptr local_288;
  pointer local_280;
  vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  pointer local_248;
  pointer local_240;
  pointer local_238;
  vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  local_230;
  vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  local_218;
  string obj_dir;
  vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_> installGens;
  Value launchers;
  _Base_ptr local_178 [6];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  BacktraceData *local_138;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
  *local_130;
  _Rb_tree_node_base *local_128;
  Value folder;
  Value dependencies;
  Value compileGroups;
  Value sourceGroups;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  targetType = cmGeneratorTarget::GetType(this->GT);
  psVar28 = cmGeneratorTarget::GetName_abi_cxx11_(this->GT);
  Json::Value::Value(&artifact,psVar28);
  pVVar29 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar29,&artifact);
  Json::Value::~Value(&artifact);
  psVar28 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  Json::Value::Value(&artifact,psVar28);
  pVVar29 = Json::Value::operator[](__return_storage_ptr__,"type");
  Json::Value::operator=(pVVar29,&artifact);
  Json::Value::~Value(&artifact);
  psVar28 = &this->TopBuild;
  TargetId((string *)&launchers,this->GT,psVar28);
  Json::Value::Value(&artifact,(String *)&launchers);
  pVVar29 = Json::Value::operator[](__return_storage_ptr__,"id");
  Json::Value::operator=(pVVar29,&artifact);
  Json::Value::~Value(&artifact);
  if (launchers.value_ != &launchers.comments_) {
    operator_delete(launchers.value_.string_,
                    (long)launchers.comments_.ptr_._M_t.
                          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                          .
                          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                          ._M_head_impl + 1);
  }
  Json::Value::Value(&launchers,objectValue);
  pcVar30 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  psVar31 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_(pcVar30);
  local_148._8_8_ = &this->TopSource;
  cmSystemTools::RelativeIfUnder(&p,(string *)local_148._8_8_,psVar31);
  Json::Value::Value(&artifact,&p);
  pVVar29 = Json::Value::operator[](&launchers,"source");
  Json::Value::operator=(pVVar29,&artifact);
  Json::Value::~Value(&artifact);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p._M_dataplus._M_p != &p.field_2) {
    operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
  }
  psVar31 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar30);
  cmSystemTools::RelativeIfUnder(&p,psVar28,psVar31);
  Json::Value::Value(&artifact,&p);
  pVVar29 = Json::Value::operator[](&launchers,"build");
  Json::Value::operator=(pVVar29,&artifact);
  Json::Value::~Value(&artifact);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p._M_dataplus._M_p != &p.field_2) {
    operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
  }
  pVVar29 = Json::Value::operator[](__return_storage_ptr__,"paths");
  Json::Value::operator=(pVVar29,&launchers);
  Json::Value::~Value(&launchers);
  bVar24 = cmTarget::GetIsGeneratorProvided(this->GT->Target);
  if (bVar24) {
    Json::Value::Value(&artifact,true);
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"isGeneratorProvided");
    Json::Value::operator=(pVVar29,&artifact);
    Json::Value::~Value(&artifact);
  }
  cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&artifact);
  AddBacktrace(this,__return_storage_ptr__,(cmListFileBacktrace *)&artifact);
  if (artifact._8_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)artifact._8_8_);
  }
  bVar24 = cmTarget::GetHaveInstallRule(this->GT->Target);
  if (bVar24) {
    Json::Value::Value((Value *)&obj_dir,objectValue);
    Json::Value::Value(&launchers,objectValue);
    pcVar8 = this->GT->Makefile;
    __dnew = 0x14;
    artifact.value_ = (ValueHolder)&artifact.comments_;
    artifact.value_.int_ = std::__cxx11::string::_M_create((ulong *)&artifact,(ulong)&__dnew);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._0_4_ = (uint)__dnew;
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._4_1_ = (undefined1)(__dnew >> 0x20);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._5_1_ = (undefined1)(__dnew >> 0x28);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._6_1_ = (undefined1)(__dnew >> 0x30);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._7_1_ = (undefined1)(__dnew >> 0x38);
    builtin_strncpy((char *)artifact.value_,"CMAKE_IN",8);
    *(undefined8 *)&((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
         0x52505f4c4c415453;
    *(undefined4 *)&((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent
         = 0x58494645;
    artifact._8_8_ = __dnew;
    artifact.value_.string_[__dnew] = '\0';
    psVar31 = cmMakefile::GetSafeDefinition(pcVar8,(string *)&artifact);
    p._M_dataplus._M_p = (pointer)&p.field_2;
    pcVar62 = (psVar31->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&p,pcVar62,pcVar62 + psVar31->_M_string_length);
    if (artifact.value_ != &artifact.comments_) {
      operator_delete(artifact.value_.string_,
                      CONCAT17(artifact.comments_.ptr_._M_t.
                               super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                               .
                               super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                               ._M_head_impl._7_1_,
                               CONCAT16(artifact.comments_.ptr_._M_t.
                                        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        .
                                        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                        ._M_head_impl._6_1_,
                                        CONCAT15(artifact.comments_.ptr_._M_t.
                                                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                 ._M_head_impl._5_1_,
                                                 CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&p);
    Json::Value::Value(&artifact,&p);
    pVVar29 = Json::Value::operator[](&launchers,"path");
    Json::Value::operator=(pVVar29,&artifact);
    Json::Value::~Value(&artifact);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)p._M_dataplus._M_p != &p.field_2) {
      operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
    }
    pVVar29 = Json::Value::operator[]((Value *)&obj_dir,"prefix");
    Json::Value::operator=(pVVar29,&launchers);
    Json::Value::~Value(&launchers);
    Json::Value::Value((Value *)&p,arrayValue);
    __x = cmTarget::GetInstallGenerators(this->GT->Target);
    std::vector<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>::vector
              (&installGens,__x);
    ppcVar21 = installGens.
               super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (installGens.
        super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        installGens.
        super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ppcVar55 = installGens.
                 super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      do {
        this_01 = *ppcVar55;
        Json::Value::Value(&launchers,objectValue);
        cmInstallTargetGenerator::GetDestination((string *)&__dnew,this_01,this->Config);
        Json::Value::Value(&artifact,(string *)&__dnew);
        pVVar29 = Json::Value::operator[](&launchers,"path");
        Json::Value::operator=(pVVar29,&artifact);
        Json::Value::~Value(&artifact);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew != &local_318) {
          operator_delete((void *)__dnew,local_318._M_allocated_capacity + 1);
        }
        AddBacktrace(this,&launchers,&(this_01->super_cmInstallGenerator).Backtrace);
        Json::Value::append((Value *)&p,&launchers);
        Json::Value::~Value(&launchers);
        ppcVar55 = ppcVar55 + 1;
      } while (ppcVar55 != ppcVar21);
    }
    if (installGens.
        super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(installGens.
                      super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)installGens.
                            super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)installGens.
                            super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pVVar29 = Json::Value::operator[]((Value *)&obj_dir,"destinations");
    Json::Value::operator=(pVVar29,(Value *)&p);
    Json::Value::~Value((Value *)&p);
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"install");
    Json::Value::operator=(pVVar29,(Value *)&obj_dir);
    Json::Value::~Value((Value *)&obj_dir);
  }
  bVar24 = cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  if (bVar24) {
    Json::Value::Value((Value *)&p,arrayValue);
    TVar25 = cmGeneratorTarget::GetType(this->GT);
    if (TVar25 == OBJECT_LIBRARY) {
      bVar24 = cmTarget::HasKnownObjectFileLocation(this->GT->Target,(string *)0x0);
      if (bVar24) {
        dependencies.value_.int_ = 0;
        dependencies.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
        dependencies._12_4_ = 0;
        dependencies.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl =
             (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
              )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                )0x0;
        cmGeneratorTarget::GetObjectSources
                  (this->GT,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                            &dependencies,this->Config);
        cmGeneratorTarget::GetObjectDirectory(&obj_dir,this->GT,this->Config);
        uVar45 = dependencies._8_8_;
        if (dependencies.value_.int_ != dependencies._8_8_) {
          VVar73 = dependencies.value_;
          do {
            psVar31 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                                (this->GT,*(cmSourceFile **)VVar73.string_);
            Json::Value::Value(&artifact,objectValue);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &installGens,&obj_dir,psVar31);
            cmSystemTools::RelativeIfUnder
                      ((string *)&__dnew,psVar28,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &installGens);
            Json::Value::Value(&launchers,(string *)&__dnew);
            pVVar29 = Json::Value::operator[](&artifact,"path");
            Json::Value::operator=(pVVar29,&launchers);
            Json::Value::~Value(&launchers);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__dnew != &local_318) {
              operator_delete((void *)__dnew,local_318._M_allocated_capacity + 1);
            }
            if (installGens.
                super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)&installGens.
                          super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(installGens.
                              super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)installGens.
                                    super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            }
            Json::Value::append((Value *)&p,&artifact);
            Json::Value::~Value(&artifact);
            VVar73.string_ = (char *)&((VVar73.map_)->_M_t)._M_impl.super__Rb_tree_header;
          } while (VVar73.int_ != uVar45);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_dir._M_dataplus._M_p != &obj_dir.field_2) {
          operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
        }
        if (dependencies.value_.int_ != 0) {
          operator_delete(dependencies.value_.string_,
                          (long)dependencies.comments_.ptr_._M_t.
                                super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                .
                                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                ._M_head_impl - (long)dependencies.value_);
        }
      }
    }
    else {
      Json::Value::Value(&artifact,objectValue);
      cmGeneratorTarget::GetFullPath
                ((string *)&__dnew,this->GT,this->Config,RuntimeBinaryArtifact,false);
      cmSystemTools::RelativeIfUnder(&obj_dir,psVar28,(string *)&__dnew);
      Json::Value::Value(&launchers,&obj_dir);
      pVVar29 = Json::Value::operator[](&artifact,"path");
      Json::Value::operator=(pVVar29,&launchers);
      Json::Value::~Value(&launchers);
      paVar61 = &obj_dir.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)obj_dir._M_dataplus._M_p != paVar61) {
        operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__dnew != &local_318) {
        operator_delete((void *)__dnew,local_318._M_allocated_capacity + 1);
      }
      Json::Value::append((Value *)&p,&artifact);
      Json::Value::~Value(&artifact);
      bVar24 = cmGeneratorTarget::HasImportLibrary(this->GT,this->Config);
      if (bVar24) {
        Json::Value::Value(&artifact,objectValue);
        cmGeneratorTarget::GetFullPath
                  ((string *)&__dnew,this->GT,this->Config,ImportLibraryArtifact,false);
        cmSystemTools::RelativeIfUnder(&obj_dir,psVar28,(string *)&__dnew);
        Json::Value::Value(&launchers,&obj_dir);
        pVVar29 = Json::Value::operator[](&artifact,"path");
        Json::Value::operator=(pVVar29,&launchers);
        Json::Value::~Value(&launchers);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_dir._M_dataplus._M_p != paVar61) {
          operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew != &local_318) {
          operator_delete((void *)__dnew,local_318._M_allocated_capacity + 1);
        }
        Json::Value::append((Value *)&p,&artifact);
        Json::Value::~Value(&artifact);
      }
      bVar24 = cmGeneratorTarget::IsDLLPlatform(this->GT);
      if ((((bVar24) && (TVar25 = cmGeneratorTarget::GetType(this->GT), TVar25 != STATIC_LIBRARY))
          && (pOVar32 = cmGeneratorTarget::GetOutputInfo(this->GT,this->Config),
             pOVar32 != (OutputInfo *)0x0)) && ((pOVar32->PdbDir)._M_string_length != 0)) {
        Json::Value::Value(&artifact,objectValue);
        pppcVar5 = &installGens.
                    super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pcVar62 = (pOVar32->PdbDir)._M_dataplus._M_p;
        installGens.
        super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)pppcVar5;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&installGens,pcVar62,pcVar62 + (pOVar32->PdbDir)._M_string_length);
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&installGens,
                   (ulong)installGens.
                          super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish,0,'\x01');
        cmGeneratorTarget::GetPDBName((string *)&dependencies,this->GT,this->Config);
        _Var63._M_head_impl =
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                 *)0xf;
        if (installGens.
            super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar5) {
          _Var63._M_head_impl =
               (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                *)installGens.
                  super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        if (_Var63._M_head_impl <
            (ulong)(dependencies._8_8_ +
                   (long)installGens.
                         super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish)) {
          _Var64._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl =
               (_Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                )(_Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                  )0xf;
          if (dependencies.value_ != &dependencies.comments_) {
            _Var64._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl =
                 (tuple<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  )(tuple<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                    )dependencies.comments_;
          }
          if ((ulong)_Var64._M_t.
                     super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                     .
                     super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                     ._M_head_impl <
              (ulong)(dependencies._8_8_ +
                     (long)installGens.
                           super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_00451c0e;
          puVar33 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&dependencies,0,(char *)0x0,
                               (ulong)installGens.
                                      super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
LAB_00451c0e:
          puVar33 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&installGens,dependencies.value_.uint_);
        }
        puVar1 = puVar33 + 2;
        if ((ulong *)*puVar33 == puVar1) {
          local_318._M_allocated_capacity = *puVar1;
          local_318._8_8_ = puVar33[3];
          __dnew = (size_type)&local_318;
        }
        else {
          local_318._M_allocated_capacity = *puVar1;
          __dnew = (size_type)*puVar33;
        }
        local_320 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)puVar33[1];
        *puVar33 = puVar1;
        puVar33[1] = 0;
        *(undefined1 *)puVar1 = 0;
        cmSystemTools::RelativeIfUnder(&obj_dir,psVar28,(string *)&__dnew);
        Json::Value::Value(&launchers,&obj_dir);
        pVVar29 = Json::Value::operator[](&artifact,"path");
        Json::Value::operator=(pVVar29,&launchers);
        Json::Value::~Value(&launchers);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_dir._M_dataplus._M_p != paVar61) {
          operator_delete(obj_dir._M_dataplus._M_p,obj_dir.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__dnew != &local_318) {
          operator_delete((void *)__dnew,local_318._M_allocated_capacity + 1);
        }
        if (dependencies.value_ != &dependencies.comments_) {
          operator_delete(dependencies.value_.string_,
                          (long)dependencies.comments_.ptr_._M_t.
                                super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                .
                                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                ._M_head_impl + 1);
        }
        if (installGens.
            super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar5) {
          operator_delete(installGens.
                          super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)installGens.
                                super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        Json::Value::append((Value *)&p,&artifact);
        Json::Value::~Value(&artifact);
      }
    }
    bVar24 = Json::Value::empty((Value *)&p);
    if (!bVar24) {
      pVVar29 = Json::Value::operator[](__return_storage_ptr__,"artifacts");
      Json::Value::operator=(pVVar29,(Value *)&p);
    }
    Json::Value::~Value((Value *)&p);
  }
  if (targetType - SHARED_LIBRARY < 2) {
LAB_00451db5:
    cmGeneratorTarget::GetFullName((string *)&launchers,this->GT,this->Config,RuntimeBinaryArtifact)
    ;
    Json::Value::Value(&artifact,(String *)&launchers);
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar29,&artifact);
    Json::Value::~Value(&artifact);
    if (launchers.value_ != &launchers.comments_) {
      operator_delete(launchers.value_.string_,
                      (long)launchers.comments_.ptr_._M_t.
                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            .
                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                            ._M_head_impl + 1);
    }
    Json::Value::Value(&launchers,objectValue);
    cmGeneratorTarget::GetLinkerLanguage(&p,this->GT,this->Config);
    Json::Value::Value(&artifact,&p);
    pVVar29 = Json::Value::operator[](&launchers,"language");
    Json::Value::operator=(pVVar29,&artifact);
    Json::Value::~Value(&artifact);
    DumpLinkCommandFragments(&artifact,this);
    bVar24 = Json::Value::empty(&artifact);
    if (!bVar24) {
      pVVar29 = Json::Value::operator[](&launchers,"commandFragments");
      Json::Value::operator=(pVVar29,&artifact);
    }
    Json::Value::~Value(&artifact);
    pcVar8 = this->GT->Makefile;
    pCVar6 = &artifact.comments_;
    obj_dir._M_dataplus._M_p = (pointer)0x12;
    artifact.value_ = (ValueHolder)pCVar6;
    artifact.value_.int_ = std::__cxx11::string::_M_create((ulong *)&artifact,(ulong)&obj_dir);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._0_4_ = (uint)obj_dir._M_dataplus._M_p;
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._4_1_ = (undefined1)((ulong)obj_dir._M_dataplus._M_p >> 0x20);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._5_1_ = (undefined1)((ulong)obj_dir._M_dataplus._M_p >> 0x28);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._6_1_ = (undefined1)((ulong)obj_dir._M_dataplus._M_p >> 0x30);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._7_1_ = (undefined1)((ulong)obj_dir._M_dataplus._M_p >> 0x38);
    builtin_strncpy((char *)artifact.value_,"CMAKE_SY",8);
    *(undefined8 *)&((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
         0x494c5f544f4f5253;
    *(undefined2 *)&((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent
         = 0x4b4e;
    artifact._8_8_ = obj_dir._M_dataplus._M_p;
    artifact.value_.string_[(long)obj_dir._M_dataplus._M_p] = '\0';
    cVar34 = cmMakefile::GetDefinition(pcVar8,(string *)&artifact);
    psVar31 = extraout_RDX;
    if (artifact.value_ != pCVar6) {
      operator_delete(artifact.value_.string_,
                      CONCAT17(artifact.comments_.ptr_._M_t.
                               super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                               .
                               super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                               ._M_head_impl._7_1_,
                               CONCAT16(artifact.comments_.ptr_._M_t.
                                        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        .
                                        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                        ._M_head_impl._6_1_,
                                        CONCAT15(artifact.comments_.ptr_._M_t.
                                                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                 ._M_head_impl._5_1_,
                                                 CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
      psVar31 = extraout_RDX_00;
    }
    if (cVar34.Value == (string *)0x0) {
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._0_4_ = 0x4b414d43;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._4_1_ = 0x45;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._5_1_ = 0x5f;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._6_1_ = 0x53;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._7_1_ = 0x59;
      artifact.start_._0_5_ = 0x544f4f5253;
      artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0xd;
      artifact._12_4_ = 0;
      artifact.start_._5_1_ = 0;
      artifact.value_ = (ValueHolder)pCVar6;
      cVar34 = cmMakefile::GetDefinition(this->GT->Makefile,(string *)&artifact);
      psVar31 = extraout_RDX_01;
      if (artifact.value_ != pCVar6) {
        operator_delete(artifact.value_.string_,
                        CONCAT17(artifact.comments_.ptr_._M_t.
                                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                 .
                                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                 ._M_head_impl._7_1_,
                                 CONCAT16(artifact.comments_.ptr_._M_t.
                                          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                          .
                                          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                          ._M_head_impl._6_1_,
                                          CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
        psVar31 = extraout_RDX_02;
      }
      if (cVar34.Value != (string *)0x0) {
        DumpSysroot(&artifact,(Target *)cVar34.Value,psVar31);
        pVVar29 = Json::Value::operator[](&launchers,"sysroot");
        goto LAB_00452036;
      }
    }
    else {
      DumpSysroot(&artifact,(Target *)cVar34.Value,psVar31);
      pVVar29 = Json::Value::operator[](&launchers,"sysroot");
LAB_00452036:
      Json::Value::operator=(pVVar29,&artifact);
      Json::Value::~Value(&artifact);
    }
    bVar24 = cmGeneratorTarget::IsIPOEnabled(this->GT,&p,this->Config);
    if (bVar24) {
      Json::Value::Value(&artifact,true);
      pVVar29 = Json::Value::operator[](&launchers,"lto");
      Json::Value::operator=(pVVar29,&artifact);
      Json::Value::~Value(&artifact);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)p._M_dataplus._M_p != &p.field_2) {
      operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
    }
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"link");
    Json::Value::operator=(pVVar29,&launchers);
    Json::Value::~Value(&launchers);
    if (targetType != EXECUTABLE) goto LAB_0045240b;
    Json::Value::Value(&launchers,nullValue);
    DumpLauncher(&artifact,this,"TEST_LAUNCHER","test");
    bVar24 = Json::Value::empty(&artifact);
    if (!bVar24) {
      Json::Value::append(&launchers,&artifact);
    }
    Json::Value::~Value(&artifact);
    pcVar8 = this->GT->Makefile;
    p._M_dataplus._M_p = &DAT_00000014;
    artifact.value_ = (ValueHolder)pCVar6;
    artifact.value_.int_ = std::__cxx11::string::_M_create((ulong *)&artifact,(ulong)&p);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._0_4_ = (uint)p._M_dataplus._M_p;
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._4_1_ = (undefined1)((ulong)p._M_dataplus._M_p >> 0x20);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._5_1_ = (undefined1)((ulong)p._M_dataplus._M_p >> 0x28);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._6_1_ = (undefined1)((ulong)p._M_dataplus._M_p >> 0x30);
    artifact.comments_.ptr_._M_t.
    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
    .
    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
    ._M_head_impl._7_1_ = (undefined1)((ulong)p._M_dataplus._M_p >> 0x38);
    builtin_strncpy((char *)artifact.value_,"CMAKE_CR",8);
    *(undefined8 *)&((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
         0x49504d4f4353534f;
    *(undefined4 *)&((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent
         = 0x474e494c;
    artifact._8_8_ = p._M_dataplus._M_p;
    artifact.value_.string_[(long)p._M_dataplus._M_p] = '\0';
    bVar24 = cmMakefile::IsOn(pcVar8,(string *)&artifact);
    if (artifact.value_ != pCVar6) {
      operator_delete(artifact.value_.string_,
                      CONCAT17(artifact.comments_.ptr_._M_t.
                               super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                               .
                               super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                               ._M_head_impl._7_1_,
                               CONCAT16(artifact.comments_.ptr_._M_t.
                                        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                        .
                                        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                        ._M_head_impl._6_1_,
                                        CONCAT15(artifact.comments_.ptr_._M_t.
                                                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                 ._M_head_impl._5_1_,
                                                 CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
    }
    if (bVar24) {
      DumpLauncher(&artifact,this,"CROSSCOMPILING_EMULATOR","emulator");
      bVar24 = Json::Value::empty(&artifact);
      if (!bVar24) {
        Json::Value::append(&launchers,&artifact);
      }
      Json::Value::~Value(&artifact);
    }
    bVar24 = Json::Value::empty(&launchers);
    if (!bVar24) {
      pVVar29 = Json::Value::operator[](__return_storage_ptr__,"launchers");
      Json::Value::operator=(pVVar29,&launchers);
    }
  }
  else {
    if (targetType != STATIC_LIBRARY) {
      if (targetType != EXECUTABLE) goto LAB_0045240b;
      goto LAB_00451db5;
    }
    cmGeneratorTarget::GetFullName((string *)&launchers,this->GT,this->Config,RuntimeBinaryArtifact)
    ;
    Json::Value::Value(&artifact,(String *)&launchers);
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"nameOnDisk");
    Json::Value::operator=(pVVar29,&artifact);
    Json::Value::~Value(&artifact);
    if (launchers.value_ != &launchers.comments_) {
      operator_delete(launchers.value_.string_,
                      (long)launchers.comments_.ptr_._M_t.
                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            .
                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                            ._M_head_impl + 1);
    }
    Json::Value::Value(&launchers,objectValue);
    DumpLinkCommandFragments(&artifact,this);
    bVar24 = Json::Value::empty(&artifact);
    if (!bVar24) {
      pVVar29 = Json::Value::operator[](&launchers,"commandFragments");
      Json::Value::operator=(pVVar29,&artifact);
    }
    Json::Value::~Value(&artifact);
    cmGeneratorTarget::GetLinkerLanguage(&p,this->GT,this->Config);
    bVar24 = cmGeneratorTarget::IsIPOEnabled(this->GT,&p,this->Config);
    if (bVar24) {
      Json::Value::Value(&artifact,true);
      pVVar29 = Json::Value::operator[](&launchers,"lto");
      Json::Value::operator=(pVVar29,&artifact);
      Json::Value::~Value(&artifact);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)p._M_dataplus._M_p != &p.field_2) {
      operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
    }
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"archive");
    Json::Value::operator=(pVVar29,&launchers);
  }
  Json::Value::~Value(&launchers);
LAB_0045240b:
  Json::Value::Value(&dependencies,arrayValue);
  this_02 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
  pTVar35 = cmGlobalGenerator::GetTargetDirectDepends(this_02,this->GT);
  p_Var36 = (pTVar35->
            super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
            _M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var56 = &(pTVar35->
             super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
             _M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var36 != p_Var56) {
    do {
      Json::Value::Value(&launchers,objectValue);
      TargetId(&p,*(cmGeneratorTarget **)(p_Var36 + 1),psVar28);
      Json::Value::Value(&artifact,&p);
      pVVar29 = Json::Value::operator[](&launchers,"id");
      Json::Value::operator=(pVVar29,&artifact);
      Json::Value::~Value(&artifact);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)p._M_dataplus._M_p != &p.field_2) {
        operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
      }
      AddBacktrace(this,&launchers,(cmListFileBacktrace *)&p_Var36[1]._M_left);
      Json::Value::append(&dependencies,&launchers);
      Json::Value::~Value(&launchers);
      p_Var36 = (_Base_ptr)std::_Rb_tree_increment(p_Var36);
    } while ((_Rb_tree_header *)p_Var36 != p_Var56);
  }
  bVar24 = Json::Value::empty(&dependencies);
  if (!bVar24) {
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"dependencies");
    Json::Value::operator=(pVVar29,&dependencies);
  }
  p._M_string_length = (ulong)p._M_string_length._4_4_ << 0x20;
  p.field_2._M_allocated_capacity = 0;
  p.field_2._8_8_ = &p._M_string_length;
  cmGeneratorTarget::GetLanguages
            (this->GT,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p,this->Config);
  if ((size_type *)p.field_2._8_8_ != &p._M_string_length) {
    local_130 = &this->CompileDataMap;
    local_148._M_allocated_capacity =
         (size_type)&(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header;
    local_138 = &this->Backtraces;
    uVar45 = p.field_2._8_8_;
    do {
      __x_00 = (_Rb_tree_node_base *)(uVar45 + 0x20);
      local_128 = (_Rb_tree_node_base *)uVar45;
      iVar37 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
               ::lower_bound(local_130,(key_type *)__x_00);
      if ((iVar37._M_node == (_Base_ptr)local_148._M_allocated_capacity) ||
         (iVar26 = std::__cxx11::string::compare((string *)__x_00), iVar26 < 0)) {
        p_Var38 = (_Base_ptr)operator_new(0x130);
        __k = (_Link_type)(p_Var38 + 1);
        *(_Base_ptr **)(p_Var38 + 1) = &p_Var38[1]._M_left;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__k,*(long *)(local_128 + 1),
                   (long)&(local_128[1]._M_parent)->_M_color + *(long *)(local_128 + 1));
        *(undefined8 *)(p_Var38 + 3) = 0;
        p_Var38[3]._M_parent = (_Base_ptr)0x0;
        *(undefined8 *)(p_Var38 + 4) = 0;
        p_Var38[4]._M_parent = (_Base_ptr)0x0;
        p_Var38[4]._M_left = (_Base_ptr)0x0;
        p_Var38[4]._M_right = (_Base_ptr)0x0;
        p_Var38[3]._M_left = (_Base_ptr)0x0;
        p_Var38[3]._M_right = (_Base_ptr)0x0;
        p_Var38[2]._M_left = (_Base_ptr)0x0;
        p_Var38[2]._M_right = (_Base_ptr)0x0;
        *(_Base_ptr **)(p_Var38 + 2) = &p_Var38[2]._M_left;
        p_Var38[2]._M_parent = (_Base_ptr)0x0;
        *(_Base_ptr **)(p_Var38 + 3) = &p_Var38[3]._M_left;
        *(_Base_ptr **)(p_Var38 + 4) = &p_Var38[4]._M_left;
        memset(p_Var38 + 5,0,0x90);
        local_2f8._M_p = (pointer)p_Var38;
        if (iVar37._M_node == (_Base_ptr)local_148._M_allocated_capacity) {
          if (((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
             (__p = __k,
             iVar26 = std::__cxx11::string::compare
                                ((string *)
                                 ((this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_right + 1)), -1 < iVar26)) {
LAB_0045274c:
            __p = __k;
            pVar75 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                     ::_M_get_insert_unique_pos(&local_130->_M_t,(key_type *)__k);
          }
          else {
            p_Var38 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_00452770:
            auVar15._8_8_ = 0;
            auVar15._0_8_ = p_Var38;
            pVar75 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar15 << 0x40);
          }
LAB_00452773:
          iVar37._M_node = pVar75.first;
          if (pVar75.second == (_Rb_tree_node_base *)0x0) {
LAB_004527a8:
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
            ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                            *)local_2f8._M_p,__p);
            goto LAB_004527e7;
          }
LAB_0045277b:
          iVar37._M_node = pVar75.second;
          bVar24 = true;
          if (((_Base_ptr)local_148._M_allocated_capacity != iVar37._M_node) &&
             (pVar75.first == (_Rb_tree_node_base *)0x0)) {
            std::__cxx11::string::compare((string *)__k);
            bVar24 = (bool)(extraout_var >> 7);
          }
        }
        else {
          __p = (_Link_type)(iVar37._M_node + 1);
          iVar26 = std::__cxx11::string::compare((string *)__k);
          if (-1 < iVar26) {
            __p = __k;
            iVar26 = std::__cxx11::string::compare((string *)(iVar37._M_node + 1));
            if (iVar26 < 0) {
              p_Var38 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
              ;
              if (p_Var38 == iVar37._M_node) goto LAB_00452770;
              p_Var39 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar37._M_node);
              __p = (_Link_type)(p_Var39 + 1);
              iVar26 = std::__cxx11::string::compare((string *)__k);
              if (-1 < iVar26) goto LAB_0045274c;
              pVar75.second = p_Var39;
              pVar75.first = p_Var39;
              iVar40 = iVar37;
              if ((iVar37._M_node)->_M_right == (_Base_ptr)0x0) goto LAB_00453078;
              goto LAB_00452773;
            }
            goto LAB_004527a8;
          }
          p_Var38 = (this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pVar75.second = p_Var38;
          pVar75.first = p_Var38;
          if (p_Var38 == iVar37._M_node) goto LAB_00452773;
          iVar40._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar37._M_node);
          iVar26 = std::__cxx11::string::compare((string *)(iVar40._M_node + 1));
          if (-1 < iVar26) goto LAB_0045274c;
          bVar24 = true;
          if ((iVar40._M_node)->_M_right == (_Base_ptr)0x0) {
LAB_00453078:
            auVar16._8_8_ = 0;
            auVar16._0_8_ = iVar40._M_node;
            pVar75 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar16 << 0x40);
            goto LAB_0045277b;
          }
        }
        _Var19._M_p = local_2f8._M_p;
        std::_Rb_tree_insert_and_rebalance
                  (bVar24,(_Rb_tree_node_base *)local_2f8._M_p,iVar37._M_node,
                   (_Rb_tree_node_base *)local_148._M_allocated_capacity);
        psVar3 = &(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        *psVar3 = *psVar3 + 1;
        iVar37._M_node = (_Base_ptr)_Var19._M_p;
      }
LAB_004527e7:
      std::__cxx11::string::_M_assign((string *)(iVar37._M_node + 2));
      pcVar8 = this->GT->Makefile;
      artifact.value_.string_ = (char *)&artifact.comments_;
      launchers.value_.int_ = 0x15;
      artifact.value_.int_ = std::__cxx11::string::_M_create((ulong *)&artifact,(ulong)&launchers);
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._0_4_ = (uint)launchers.value_.int_;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._4_1_ = (undefined1)((ulong)launchers.value_ >> 0x20);
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._5_1_ = (undefined1)((ulong)launchers.value_ >> 0x28);
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._6_1_ = (undefined1)((ulong)launchers.value_ >> 0x30);
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._7_1_ = (undefined1)((ulong)launchers.value_ >> 0x38);
      builtin_strncpy((char *)artifact.value_,"CMAKE_SY",8);
      *(undefined8 *)&((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
           0x4f435f544f4f5253;
      *(undefined8 *)
       &((artifact.value_.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header.field_0x5 =
           0x454c49504d4f435f;
      artifact._8_8_ = launchers.value_;
      artifact.value_.string_[launchers.value_.string_] = '\0';
      cVar34 = cmMakefile::GetDefinition(pcVar8,(string *)&artifact);
      if (artifact.value_ != &artifact.comments_) {
        operator_delete(artifact.value_.string_,
                        CONCAT17(artifact.comments_.ptr_._M_t.
                                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                 .
                                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                 ._M_head_impl._7_1_,
                                 CONCAT16(artifact.comments_.ptr_._M_t.
                                          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                          .
                                          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                          ._M_head_impl._6_1_,
                                          CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
      }
      local_2f8._M_p = (pointer)iVar37._M_node;
      if (cVar34.Value == (string *)0x0) {
        artifact.start_._0_5_ = 0x544f4f5253;
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._0_4_ = 0x4b414d43;
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._4_1_ = 0x45;
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._5_1_ = 0x5f;
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._6_1_ = 0x53;
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._7_1_ = 0x59;
        artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0xd;
        artifact._12_4_ = 0;
        artifact.start_._5_1_ = 0;
        artifact.value_ = (ValueHolder)&artifact.comments_;
        cVar34 = cmMakefile::GetDefinition(this->GT->Makefile,(string *)&artifact);
        if (artifact.value_ != &artifact.comments_) {
          operator_delete(artifact.value_.string_,
                          CONCAT17(artifact.comments_.ptr_._M_t.
                                   super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   .
                                   super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                   ._M_head_impl._7_1_,
                                   CONCAT16(artifact.comments_.ptr_._M_t.
                                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            .
                                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                            ._M_head_impl._6_1_,
                                            CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
        }
        if (cVar34.Value != (string *)0x0) goto LAB_00452935;
      }
      else {
LAB_00452935:
        std::__cxx11::string::_M_assign((string *)(local_2f8._M_p + 0x60));
      }
      pcVar30 = cmGeneratorTarget::GetLocalGenerator(this->GT);
      artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
      artifact._12_4_ = 0;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._0_4_ =
           (uint)artifact.comments_.ptr_._M_t.
                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 .
                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                 ._M_head_impl & 0xffffff00;
      artifact.value_ = (ValueHolder)&artifact.comments_;
      cmLocalGenerator::GetTargetCompileFlags
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&launchers,pcVar30,this->GT,this->Config,(string *)__x_00,(string *)&artifact);
      if (artifact.value_ != &artifact.comments_) {
        operator_delete(artifact.value_.string_,
                        CONCAT17(artifact.comments_.ptr_._M_t.
                                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                 .
                                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                 ._M_head_impl._7_1_,
                                 CONCAT16(artifact.comments_.ptr_._M_t.
                                          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                          .
                                          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                          ._M_head_impl._6_1_,
                                          CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
      }
      pvVar4 = (vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                *)(local_2f8._M_p + 0xb8);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)pvVar4,(launchers._8_8_ - (long)launchers.value_ >> 4) * -0x5555555555555555);
      uVar45 = launchers._8_8_;
      for (VVar73 = launchers.value_; VVar73.int_ != uVar45;
          VVar73.string_ = (char *)(VVar73.int_ + 0x30)) {
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&artifact,this,
                   (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)VVar73.map_);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                  (pvVar4,(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&artifact);
        if (artifact.value_ != &artifact.comments_) {
          operator_delete(artifact.value_.string_,
                          CONCAT17(artifact.comments_.ptr_._M_t.
                                   super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   .
                                   super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                   ._M_head_impl._7_1_,
                                   CONCAT16(artifact.comments_.ptr_._M_t.
                                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            .
                                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                            ._M_head_impl._6_1_,
                                            CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
        }
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&launchers);
      cmLocalGenerator::GetTargetDefines
                ((set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&launchers,pcVar30,this->GT,this->Config,(string *)__x_00);
      pvVar4 = (vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                *)(local_2f8._M_p + 0xd0);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)pvVar4,(size_type)local_178[0]);
      for (p_Var39 = (_Rb_tree_node_base *)launchers.start_;
          p_Var39 != (_Rb_tree_node_base *)&launchers.bits_;
          p_Var39 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var39)) {
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&artifact,this,
                   (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(p_Var39 + 1));
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                  (pvVar4,(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&artifact);
        if (artifact.value_ != &artifact.comments_) {
          operator_delete(artifact.value_.string_,
                          CONCAT17(artifact.comments_.ptr_._M_t.
                                   super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   .
                                   super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                   ._M_head_impl._7_1_,
                                   CONCAT16(artifact.comments_.ptr_._M_t.
                                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            .
                                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                            ._M_head_impl._6_1_,
                                            CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
        }
      }
      cmLocalGenerator::GetIncludeDirectories
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__dnew,pcVar30,this->GT,(string *)__x_00,this->Config);
      pBVar65 = local_320;
      if ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          __dnew != local_320) {
        p_Var38 = (_Base_ptr)(local_2f8._M_p + 0x100);
        this_00 = (vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                   *)(local_2f8._M_p + 0x118);
        bt_01 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)__dnew;
        do {
          bVar24 = cmGeneratorTarget::IsApple(this->GT);
          if ((bVar24) && (bVar24 = cmSystemTools::IsPathToFramework(&bt_01->Value), bVar24)) {
            (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                      ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&artifact,this,bt_01);
            bVar24 = cmGeneratorTarget::IsSystemIncludeDirectory
                               (this->GT,&bt_01->Value,this->Config,(string *)__x_00);
            obj_dir._M_dataplus._M_p._0_1_ = bVar24;
            std::
            vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
            ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>,bool>
                      (this_00,(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&artifact,(bool *)&obj_dir);
          }
          else {
            (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                      ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&artifact,this,bt_01);
            bVar24 = cmGeneratorTarget::IsSystemIncludeDirectory
                               (this->GT,&bt_01->Value,this->Config,(string *)__x_00);
            obj_dir._M_dataplus._M_p._0_1_ = bVar24;
            std::
            vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
            ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>,bool>
                      ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                        *)p_Var38,
                       (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&artifact,(bool *)&obj_dir);
          }
          if (artifact.value_ != &artifact.comments_) {
            operator_delete(artifact.value_.string_,
                            CONCAT17(artifact.comments_.ptr_._M_t.
                                     super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                     .
                                     super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                     ._M_head_impl._7_1_,
                                     CONCAT16(artifact.comments_.ptr_._M_t.
                                              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                              .
                                              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                              ._M_head_impl._6_1_,
                                              CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
          }
          bt_01 = bt_01 + 1;
        } while (bt_01 != pBVar65);
      }
      cmGeneratorTarget::GetPrecompileHeaders
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&installGens,this->GT,this->Config,(string *)__x_00);
      ppcVar21 = installGens.
                 super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (installGens.
          super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          installGens.
          super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pvVar4 = (vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  *)(local_2f8._M_p + 0xe8);
        pBVar65 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)installGens.
                     super__Vector_base<cmInstallTargetGenerator_*,_std::allocator<cmInstallTargetGenerator_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        do {
          (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                    ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&artifact,this,pBVar65);
          std::
          vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
          ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                    (pvVar4,(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&artifact);
          if (artifact.value_ != &artifact.comments_) {
            operator_delete(artifact.value_.string_,
                            CONCAT17(artifact.comments_.ptr_._M_t.
                                     super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                     .
                                     super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                     ._M_head_impl._7_1_,
                                     CONCAT16(artifact.comments_.ptr_._M_t.
                                              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                              .
                                              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                              ._M_head_impl._6_1_,
                                              CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
          }
          pBVar65 = pBVar65 + 1;
        } while (pBVar65 !=
                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)ppcVar21);
      }
      pBVar41 = cmGeneratorTarget::GetLanguageStandardProperty
                          (this->GT,(string *)__x_00,this->Config);
      if (pBVar41 !=
          (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          0x0) {
        bt_02 = (pBVar41->Backtraces).
                super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                _M_impl.super__Vector_impl_data._M_start;
        pcVar50 = (pBVar41->Backtraces).
                  super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        p_Var57 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                   *)((long)pcVar50 - (long)bt_02 >> 4);
        if ((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
             *)0x1fffffffffffffff < p_Var57) {
          std::__throw_length_error("vector::reserve");
        }
        if (pcVar50 == bt_02) {
          local_368 = (pointer)0x0;
          pJVar42 = (pointer)0x0;
          pJVar17 = pJVar42;
        }
        else {
          pJVar42 = std::
                    _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                    ::_M_allocate(p_Var57,(size_t)__x_00);
          local_368 = pJVar42 + (long)p_Var57;
          bt_02 = (pBVar41->Backtraces).
                  super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                  _M_impl.super__Vector_impl_data._M_start;
          pcVar50 = (pBVar41->Backtraces).
                    super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          pJVar17 = pJVar42;
        }
        for (; bt_02 != pcVar50; bt_02 = bt_02 + 1) {
          __n_00 = bt_02;
          JVar27 = BacktraceData::Add(local_138,bt_02);
          if (pJVar42 == local_368) {
            uVar67 = (long)pJVar42 - (long)pJVar17;
            if (uVar67 == 0x7ffffffffffffffc) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar43 = (long)uVar67 >> 2;
            uVar51 = uVar43;
            if (pJVar42 == pJVar17) {
              uVar51 = 1;
            }
            p_Var57 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                       *)(uVar51 + uVar43);
            if ((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                 *)0x1ffffffffffffffe < p_Var57) {
              p_Var57 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                         *)0x1fffffffffffffff;
            }
            if (CARRY8(uVar51,uVar43)) {
              p_Var57 = (_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                         *)0x1fffffffffffffff;
            }
            local_378 = std::
                        _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                        ::_M_allocate(p_Var57,(size_t)__n_00);
            *(ArrayIndex *)((long)local_378 + uVar67) = JVar27.Index;
            pJVar58 = local_378;
            for (pJVar44 = pJVar17; pJVar42 != pJVar44; pJVar44 = pJVar44 + 1) {
              pJVar58->Index = pJVar44->Index;
              pJVar58 = pJVar58 + 1;
            }
            if (pJVar17 != (pointer)0x0) {
              operator_delete(pJVar17,uVar67);
            }
            local_368 = local_378 + (long)p_Var57;
          }
          else {
            pJVar42->Index = JVar27.Index;
            pJVar58 = pJVar42;
            local_378 = pJVar17;
          }
          pJVar42 = pJVar58 + 1;
          pJVar17 = local_378;
        }
        obj_dir._M_dataplus._M_p = (pointer)&obj_dir.field_2;
        pcVar62 = (pBVar41->Value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&obj_dir,pcVar62,pcVar62 + (pBVar41->Value)._M_string_length);
        _Var19._M_p = local_2f8._M_p;
        artifact.limit_ =
             (ptrdiff_t)
             std::
             _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
             ::_M_allocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                            *)((long)pJVar42 - (long)pJVar17 >> 2),(size_t)pcVar62);
        p_Var36 = (_Base_ptr)artifact.limit_;
        for (pJVar58 = pJVar17; pJVar58 != pJVar42; pJVar58 = pJVar58 + 1) {
          p_Var36->_M_color = pJVar58->Index;
          p_Var36 = (_Base_ptr)&p_Var36->field_0x4;
        }
        artifact.value_.string_ = (char *)&artifact.comments_;
        paVar61 = &obj_dir.field_2;
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._4_1_ = (undefined1)((ulong)obj_dir.field_2._0_8_ >> 0x20);
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._5_1_ = (undefined1)((ulong)obj_dir.field_2._0_8_ >> 0x28);
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._6_1_ = (undefined1)((ulong)obj_dir.field_2._0_8_ >> 0x30);
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._7_1_ = (undefined1)((ulong)obj_dir.field_2._0_8_ >> 0x38);
        artifact.comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl._0_4_ = (uint)obj_dir.field_2._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)obj_dir._M_dataplus._M_p == paVar61) {
          artifact.start_._0_5_ = (undefined5)obj_dir.field_2._8_8_;
          artifact.start_._5_1_ = (undefined1)((ulong)obj_dir.field_2._8_8_ >> 0x28);
          artifact.start_._6_2_ = (undefined2)((ulong)obj_dir.field_2._8_8_ >> 0x30);
        }
        else {
          artifact.value_ = (ValueHolder)obj_dir._M_dataplus._M_p;
        }
        local_2c0._0_8_ = artifact.limit_ + ((long)pJVar42 - (long)pJVar17);
        artifact._8_8_ = obj_dir._M_string_length;
        obj_dir._M_string_length = 0;
        obj_dir.field_2._M_allocated_capacity =
             obj_dir.field_2._M_allocated_capacity & 0xffffffffffffff00;
        obj_dir._M_dataplus._M_p = (pointer)paVar61;
        if (pJVar17 != (pointer)0x0) {
          operator_delete(pJVar17,(long)local_368 - (long)pJVar17);
        }
        std::__cxx11::string::operator=((string *)(_Var19._M_p + 0x80),(string *)&artifact);
        pvVar9 = *(void **)(_Var19._M_p + 0xa0);
        p_Var60 = *(_Base_ptr *)(_Var19._M_p + 0xb0);
        *(ptrdiff_t *)(_Var19._M_p + 0xa0) = artifact.limit_;
        *(_Base_ptr *)(_Var19._M_p + 0xa8) = p_Var36;
        *(undefined8 *)(_Var19._M_p + 0xb0) = local_2c0._0_8_;
        artifact.limit_ = 0;
        local_2c0._0_8_ = (_Base_ptr)0x0;
        if ((pvVar9 != (void *)0x0) &&
           (operator_delete(pvVar9,(long)p_Var60 - (long)pvVar9), artifact.limit_ != 0)) {
          operator_delete((void *)artifact.limit_,local_2c0._0_8_ - artifact.limit_);
        }
        if (artifact.value_ != &artifact.comments_) {
          operator_delete(artifact.value_.string_,
                          CONCAT17(artifact.comments_.ptr_._M_t.
                                   super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   .
                                   super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                   ._M_head_impl._7_1_,
                                   CONCAT16(artifact.comments_.ptr_._M_t.
                                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                            .
                                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                            ._M_head_impl._6_1_,
                                            CONCAT15(artifact.comments_.ptr_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._5_1_,
                                                  CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
        }
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&installGens);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__dnew);
      std::
      _Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&launchers);
      uVar45 = std::_Rb_tree_increment(local_128);
    } while ((size_type *)uVar45 != &p._M_string_length);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&p);
  Json::Value::Value((Value *)&installGens,nullValue);
  obj_dir.field_2._8_8_ = &obj_dir._M_string_length;
  obj_dir._M_string_length = obj_dir._M_string_length & 0xffffffff00000000;
  obj_dir.field_2._M_allocated_capacity = 0;
  this_04 = (BacktraceData *)this->GT->Target;
  cmTarget::GetAllFileSetNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&compileGroups,(cmTarget *)this_04);
  if (compileGroups.value_.int_ != compileGroups._8_8_) {
    Json::Value::Value(&artifact,arrayValue);
    Json::Value::operator=((Value *)&installGens,&artifact);
    Json::Value::~Value(&artifact);
    if (compileGroups.value_.int_ != compileGroups._8_8_) {
      mVar7 = 0;
      VVar73 = compileGroups.value_;
      local_138 = this_04;
      do {
        this_03 = cmTarget::GetFileSet((cmTarget *)this_04,(string *)VVar73.map_);
        if (this_03 == (cmFileSet *)0x0) {
          pcVar8 = this->GT->Makefile;
          psVar28 = cmTarget::GetName_abi_cxx11_((cmTarget *)this_04);
          artifact.value_.int_ = 8;
          artifact._8_8_ = (long)"\nTarget \"" + 1;
          artifact.comments_.ptr_._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl._0_4_ = 0;
          artifact.comments_.ptr_._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl._4_1_ = 0;
          artifact.comments_.ptr_._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl._5_1_ = 0;
          artifact.comments_.ptr_._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl._6_1_ = 0;
          artifact.comments_.ptr_._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl._7_1_ = 0;
          artifact.limit_ = (ptrdiff_t)(psVar28->_M_dataplus)._M_p;
          sVar10 = psVar28->_M_string_length;
          artifact.start_._0_5_ = (undefined5)sVar10;
          artifact.start_._5_1_ = (undefined1)(sVar10 >> 0x28);
          artifact.start_._6_2_ = (undefined2)(sVar10 >> 0x30);
          local_2c0._0_8_ = (_Base_ptr)0x1f;
          local_2c0._8_8_ = "\" is tracked to have file set \"";
          local_2b0._M_allocated_capacity = 0;
          local_2a0._M_allocated_capacity = *(undefined8 *)VVar73.string_;
          local_2b0._8_8_ =
               *(undefined8 *)&((VVar73.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header;
          local_2a0._8_8_ = (_Base_ptr)0x0;
          local_290._M_nxt = (_Hash_node_base *)0x18;
          local_288 = (_Base_ptr)0x80d475;
          local_280 = (pointer)0x0;
          views_00._M_len = 5;
          views_00._M_array = (iterator)&artifact;
          cmCatViews(&p,views_00);
          cmMakefile::IssueMessage(pcVar8,INTERNAL_ERROR,&p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)p._M_dataplus._M_p != &p.field_2) {
            operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          cmFileSet::CompileFileEntries(&fileEntries,this_03);
          cmFileSet::CompileDirectoryEntries(&directoryEntries,this_03);
          cmFileSet::EvaluateDirectoryEntries
                    (&directories,this_03,&directoryEntries,this->GT->LocalGenerator,this->Config,
                     this->GT,(cmGeneratorExpressionDAGChecker *)0x0);
          Json::Value::Value((Value *)&__dnew,objectValue);
          Json::Value::Value(&artifact,&this_03->Name);
          pVVar29 = Json::Value::operator[]((Value *)&__dnew,"name");
          Json::Value::operator=(pVVar29,&artifact);
          Json::Value::~Value(&artifact);
          Json::Value::Value(&artifact,&this_03->Type);
          pVVar29 = Json::Value::operator[]((Value *)&__dnew,"type");
          Json::Value::operator=(pVVar29,&artifact);
          Json::Value::~Value(&artifact);
          sVar76 = cmFileSetVisibilityToName(this_03->Visibility);
          p._M_dataplus._M_p = (pointer)&p.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&p,sVar76.super_string_view._M_str,
                     sVar76.super_string_view._M_str + sVar76.super_string_view._M_len);
          Json::Value::Value(&artifact,&p);
          pVVar29 = Json::Value::operator[]((Value *)&__dnew,"visibility");
          Json::Value::operator=(pVVar29,&artifact);
          Json::Value::~Value(&artifact);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)p._M_dataplus._M_p != &p.field_2) {
            operator_delete(p._M_dataplus._M_p,p.field_2._M_allocated_capacity + 1);
          }
          Json::Value::Value(&artifact,arrayValue);
          pbVar22 = directories.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (in = directories.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; in != pbVar22; in = in + 1) {
            cmSystemTools::RelativeIfUnder((string *)&folder,(string *)local_148._8_8_,in);
            Json::Value::Value((Value *)&p,(String *)&folder);
            Json::Value::append(&artifact,(Value *)&p);
            Json::Value::~Value((Value *)&p);
            if (folder.value_ != &folder.comments_) {
              operator_delete(folder.value_.string_,
                              CONCAT71(folder.comments_.ptr_._M_t.
                                       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                       .
                                       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                       ._M_head_impl._1_7_,
                                       folder.comments_.ptr_._M_t.
                                       super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                       .
                                       super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                       ._M_head_impl._0_1_) + 1);
            }
          }
          pVVar29 = Json::Value::operator[]((Value *)&__dnew,"baseDirectories");
          Json::Value::operator=(pVVar29,&artifact);
          Json::Value::~Value(&artifact);
          Json::Value::append((Value *)&installGens,(Value *)&__dnew);
          Json::Value::~Value((Value *)&__dnew);
          puVar23 = fileEntries.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_320 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((ulong)local_320 & 0xffffffff00000000);
          local_318._M_allocated_capacity = 0;
          local_318._8_8_ = &local_320;
          local_308._8_8_ = 0;
          cge = fileEntries.
                super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          local_308._M_allocated_capacity = local_318._8_8_;
          if (fileEntries.
              super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              fileEntries.
              super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              cmFileSet::EvaluateFileEntry
                        (this_03,&directories,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                          *)&__dnew,cge,this->GT->LocalGenerator,this->Config,this->GT,
                         (cmGeneratorExpressionDAGChecker *)0x0);
              cge = cge + 1;
              uVar45 = local_318._8_8_;
            } while (cge != puVar23);
            for (; (_Rb_tree_node_base *)uVar45 != (_Rb_tree_node_base *)&local_320;
                uVar45 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar45)) {
              p_Var60 = ((_Rb_tree_node_base *)(uVar45 + 0x40))->_M_parent;
              for (p_Var36 = *(_Base_ptr *)(uVar45 + 0x40); p_Var36 != p_Var60;
                  p_Var36 = p_Var36 + 1) {
                folder.value_.string_ = (char *)&folder.comments_;
                folder.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
                folder._12_4_ = 0;
                folder.comments_.ptr_._M_t.
                super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                .
                super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                ._M_head_impl._0_1_ = 0;
                if (((_Rb_tree_node_base *)(uVar45 + 0x20))->_M_parent == (_Base_ptr)0x0) {
                  std::__cxx11::string::_M_assign((string *)&folder);
                }
                else {
                  artifact.bits_ =
                       (anon_struct_4_2_14fb5ae2_for_bits_)
                       ((_Rb_tree_node_base *)(uVar45 + 0x20))->_M_color;
                  artifact._12_4_ =
                       *(undefined4 *)&((_Rb_tree_node_base *)(uVar45 + 0x20))->field_0x4;
                  artifact.comments_.ptr_._M_t.
                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  .
                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                  ._M_head_impl._0_4_ = 0;
                  artifact.comments_.ptr_._M_t.
                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  .
                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                  ._M_head_impl._4_1_ = 0;
                  artifact.comments_.ptr_._M_t.
                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  .
                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                  ._M_head_impl._5_1_ = 0;
                  artifact.comments_.ptr_._M_t.
                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  .
                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                  ._M_head_impl._6_1_ = 0;
                  artifact.comments_.ptr_._M_t.
                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                  .
                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                  ._M_head_impl._7_1_ = 0;
                  p._M_dataplus._M_p = (pointer)0x0;
                  p._M_string_length = 1;
                  p.field_2._M_allocated_capacity =
                       (size_type)(&p.field_2._M_allocated_capacity + 1);
                  p.field_2._M_local_buf[8] = 0x2f;
                  artifact.start_._0_5_ = 1;
                  artifact.start_._5_1_ = 0;
                  artifact.start_._6_2_ = 0;
                  local_2c0._8_8_ = *(undefined8 *)p_Var36;
                  local_2c0._0_8_ = p_Var36->_M_parent;
                  local_2b0._M_allocated_capacity = 0;
                  views._M_len = 3;
                  views._M_array = (iterator)&artifact;
                  artifact.value_ = (ValueHolder)((_Rb_tree_node_base *)(uVar45 + 0x20))->_M_parent;
                  artifact.limit_ = p.field_2._M_allocated_capacity;
                  cmCatViews((string *)&sourceGroups,views);
                  std::__cxx11::string::operator=((string *)&folder,(string *)&sourceGroups);
                  if (sourceGroups.value_ != &sourceGroups.comments_) {
                    operator_delete(sourceGroups.value_.string_,
                                    (long)sourceGroups.comments_.ptr_._M_t.
                                          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                          .
                                          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                          ._M_head_impl + 1);
                  }
                }
                pmVar46 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                        *)&obj_dir,(key_type *)&folder);
                *pmVar46 = mVar7;
                if (folder.value_ != &folder.comments_) {
                  operator_delete(folder.value_.string_,
                                  CONCAT71(folder.comments_.ptr_._M_t.
                                           super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                           .
                                           super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                           ._M_head_impl._1_7_,
                                           folder.comments_.ptr_._M_t.
                                           super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                           .
                                           super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                           ._M_head_impl._0_1_) + 1);
                }
              }
            }
          }
          mVar7 = mVar7 + 1;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       *)&__dnew);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&directories);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&directoryEntries);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&fileEntries);
          this_04 = local_138;
        }
        VVar73.string_ =
             (char *)&((VVar73.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
      } while (VVar73.int_ != compileGroups._8_8_);
    }
  }
  std::
  pair<Json::Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::
  pair<Json::Value_&,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_&,_true>
            ((pair<Json::Value,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
              *)&launchers,(Value *)&installGens,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)&obj_dir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&compileGroups);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)&obj_dir);
  Json::Value::~Value((Value *)&installGens);
  bVar24 = Json::Value::isNull(&launchers);
  if (!bVar24) {
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"fileSets");
    Json::Value::operator=(pVVar29,&launchers);
  }
  Json::Value::Value((Value *)&p,arrayValue);
  pKVar47 = cmGeneratorTarget::GetKindedSources(this->GT,this->Config);
  sk = (pKVar47->Sources).
       super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pSVar11 = (pKVar47->Sources).
            super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (sk != pSVar11) {
    do {
      si = Json::Value::size((Value *)&p);
      DumpSource(&artifact,this,sk,si,(FileSetDatabase *)local_178);
      Json::Value::append((Value *)&p,&artifact);
      Json::Value::~Value(&artifact);
      sk = sk + 1;
    } while (sk != pSVar11);
  }
  pVVar29 = Json::Value::operator[](__return_storage_ptr__,"sources");
  Json::Value::operator=(pVVar29,(Value *)&p);
  Json::Value::~Value((Value *)&p);
  Json::Value::Value(&folder,nullValue);
  artifact.comments_.ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl._0_4_ = 0x444c4f46;
  artifact.comments_.ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl._4_1_ = 0x45;
  artifact.comments_.ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl._5_1_ = 0x52;
  artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x6;
  artifact._12_4_ = 0;
  artifact.comments_.ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl._6_1_ = 0;
  artifact.value_ = (ValueHolder)&artifact.comments_;
  cVar34 = cmGeneratorTarget::GetProperty(this->GT,(string *)&artifact);
  if (artifact.value_ != &artifact.comments_) {
    operator_delete(artifact.value_.string_,
                    CONCAT17(artifact.comments_.ptr_._M_t.
                             super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                             .
                             super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                             ._M_head_impl._7_1_,
                             CONCAT16(artifact.comments_.ptr_._M_t.
                                      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                      .
                                      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                      ._M_head_impl._6_1_,
                                      CONCAT15(artifact.comments_.ptr_._M_t.
                                               super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                               .
                                               super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                               ._M_head_impl._5_1_,
                                               CONCAT14(artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl._4_1_,
                                                  (uint)artifact.comments_.ptr_._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                                  ._M_head_impl)))) + 1);
  }
  if (cVar34.Value != (string *)0x0) {
    Json::Value::Value(&artifact,objectValue);
    Json::Value::operator=(&folder,&artifact);
    Json::Value::~Value(&artifact);
    Json::Value::Value(&artifact,cVar34.Value);
    pVVar29 = Json::Value::operator[](&folder,"name");
    Json::Value::operator=(pVVar29,&artifact);
    Json::Value::~Value(&artifact);
  }
  bVar24 = Json::Value::isNull(&folder);
  if (!bVar24) {
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"folder");
    Json::Value::operator=(pVVar29,&folder);
  }
  Json::Value::Value(&sourceGroups,arrayValue);
  value = (this->SourceGroups).
          super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pSVar12 = (this->SourceGroups).
            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (value != pSVar12) {
    do {
      Json::Value::Value((Value *)&p,objectValue);
      Json::Value::Value(&artifact,&value->Name);
      pVVar29 = Json::Value::operator[]((Value *)&p,"name");
      Json::Value::operator=(pVVar29,&artifact);
      Json::Value::~Value(&artifact);
      pVVar29 = Json::Value::operator[]((Value *)&p,"sourceIndexes");
      Json::Value::operator=(pVVar29,&value->SourceIndexes);
      Json::Value::append(&sourceGroups,(Value *)&p);
      Json::Value::~Value((Value *)&p);
      value = value + 1;
    } while (value != pSVar12);
  }
  bVar24 = Json::Value::empty(&sourceGroups);
  if (!bVar24) {
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"sourceGroups");
    Json::Value::operator=(pVVar29,&sourceGroups);
  }
  Json::Value::Value(&compileGroups,arrayValue);
  pCVar59 = (this->CompileGroups).
            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_138 = (BacktraceData *)
              (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if ((BacktraceData *)pCVar59 != local_138) {
    local_128 = (_Rb_tree_node_base *)&this->CompileDataMap;
    local_148._M_allocated_capacity =
         (size_type)&(this->CompileDataMap)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var13 = (pCVar59->Entry).
                super__Node_iterator_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                ._M_cur;
      artifact.value_.string_ = (char *)&artifact.comments_;
      pJVar52 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0;
      artifact.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
      artifact._12_4_ = 0;
      artifact.comments_.ptr_._M_t.
      super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
      .
      super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
      ._M_head_impl._0_4_ =
           (uint)artifact.comments_.ptr_._M_t.
                 super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                 .
                 super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                 ._M_head_impl & 0xffffff00;
      artifact.limit_ = (ptrdiff_t)local_2c0;
      local_2c0._0_8_ = local_2c0._0_8_ & 0xffffffffffffff00;
      local_2b0._M_allocated_capacity = (size_type)&local_2a0;
      local_2a0._M_allocated_capacity = local_2a0._M_allocated_capacity & 0xffffffffffffff00;
      local_2b0._8_8_ = 0;
      memset(&local_290,0,0x90);
      std::__cxx11::string::_M_assign((string *)&artifact);
      pJVar74 = local_260.
                super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (artifact._8_8_ != 0) {
        iVar37 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                 ::lower_bound((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CompileData>_>_>
                                *)local_128,(key_type *)&artifact);
        if ((iVar37._M_node == (_Base_ptr)local_148._M_allocated_capacity) ||
           (iVar26 = std::__cxx11::string::compare((string *)&artifact), iVar26 < 0)) {
          std::__throw_out_of_range("map::at");
        }
        p_Var38 = iVar37._M_node + 3;
        std::__cxx11::string::_M_assign((string *)&artifact.limit_);
        iVar40 = iVar37;
        if ((pointer *)&iVar37._M_node[7]._M_parent != &local_248) {
          p_Var36 = iVar37._M_node[7]._M_parent;
          p_Var60 = iVar37._M_node[7]._M_left;
          local_148._8_8_ = (long)p_Var60 - (long)p_Var36;
          local_2f8._M_p = (pointer)iVar37;
          if ((string *)((long)local_238 - (long)local_248) < (ulong)local_148._8_8_) {
            pJVar48 = std::
                      _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::_M_allocate((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)(((long)local_148._8_8_ >> 3) * -0x3333333333333333),
                                    (size_t)p_Var38);
            pJVar74 = pJVar48;
            pJVar66 = local_240;
            for (; local_240 = pJVar66, p_Var36 != p_Var60;
                p_Var36 = (_Base_ptr)&p_Var36[1]._M_parent) {
              (pJVar74->Value)._M_dataplus._M_p = (pointer)&(pJVar74->Value).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)pJVar74,*(long *)p_Var36,
                         (long)&p_Var36->_M_parent->_M_color + *(long *)p_Var36);
              (pJVar74->Backtrace).Index = p_Var36[1]._M_color;
              pJVar74 = pJVar74 + 1;
              pJVar66 = local_240;
            }
            if (local_248 != pJVar66) {
              paVar61 = &(local_248->Value).field_2;
              do {
                plVar14 = (long *)(((String *)(paVar61 + -1))->_M_dataplus)._M_p;
                if (paVar61 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar14) {
                  operator_delete(plVar14,paVar61->_M_allocated_capacity + 1);
                }
                pJVar74 = (pointer)((long)paVar61 + 0x18);
                paVar61 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)paVar61 + 0x28);
              } while (pJVar74 != pJVar66);
            }
            if (local_248 != (pointer)0x0) {
              operator_delete(local_248,(long)local_238 - (long)local_248);
            }
            local_238 = (pointer)((long)&(pJVar48->Value)._M_dataplus._M_p + local_148._8_8_);
            local_248 = pJVar48;
          }
          else {
            psVar28 = (string *)((long)local_240 - (long)local_248);
            if (psVar28 < (ulong)local_148._8_8_) {
              if (0 < (long)psVar28) {
                uVar67 = (ulong)psVar28 / 0x28 + 1;
                pJVar74 = local_248;
                do {
                  std::__cxx11::string::_M_assign((string *)pJVar74);
                  (pJVar74->Backtrace).Index = p_Var36[1]._M_color;
                  p_Var36 = (_Base_ptr)&p_Var36[1]._M_parent;
                  pJVar74 = pJVar74 + 1;
                  uVar67 = uVar67 - 1;
                } while (1 < uVar67);
                p_Var36 = iVar37._M_node[7]._M_parent;
                p_Var60 = iVar37._M_node[7]._M_left;
                psVar28 = (string *)((long)local_240 - (long)local_248);
              }
              pJVar74 = local_240;
              for (p_Var36 = (_Base_ptr)((long)&p_Var36->_M_color + (long)&psVar28->_M_dataplus);
                  p_Var36 != p_Var60; p_Var36 = (_Base_ptr)&p_Var36[1]._M_parent) {
                (pJVar74->Value)._M_dataplus._M_p = (pointer)&(pJVar74->Value).field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)pJVar74,*(long *)p_Var36,
                           (long)&p_Var36->_M_parent->_M_color + *(long *)p_Var36);
                (pJVar74->Backtrace).Index = p_Var36[1]._M_color;
                pJVar74 = pJVar74 + 1;
              }
            }
            else {
              pJVar74 = local_248;
              pJVar66 = local_248;
              if (0 < (long)local_148._8_8_) {
                uVar67 = (ulong)local_148._8_8_ / 0x28 + 1;
                do {
                  std::__cxx11::string::_M_assign((string *)pJVar66);
                  (pJVar66->Backtrace).Index = p_Var36[1]._M_color;
                  p_Var36 = (_Base_ptr)&p_Var36[1]._M_parent;
                  pJVar66 = pJVar66 + 1;
                  uVar67 = uVar67 - 1;
                  pJVar74 = pJVar74 + 1;
                } while (1 < uVar67);
              }
              pJVar48 = local_240;
              if (pJVar66 != local_240) {
                paVar61 = &(pJVar74->Value).field_2;
                do {
                  plVar14 = (long *)(((String *)(paVar61 + -1))->_M_dataplus)._M_p;
                  if (paVar61 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar14) {
                    operator_delete(plVar14,paVar61->_M_allocated_capacity + 1);
                  }
                  pJVar74 = (pointer)((long)paVar61 + 0x18);
                  paVar61 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)paVar61 + 0x28);
                } while (pJVar74 != pJVar48);
              }
            }
          }
          local_240 = (pointer)((long)&(local_248->Value)._M_dataplus._M_p + local_148._8_8_);
          iVar40._M_node = (_Base_ptr)local_2f8._M_p;
        }
        paVar61 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(iVar40._M_node + 4);
        std::__cxx11::string::_M_assign((string *)local_2b0._M_local_buf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(iVar40._M_node + 4) != &local_2b0) {
          p_Var36 = *(_Base_ptr *)(iVar37._M_node + 5);
          p_Var60 = iVar37._M_node[5]._M_parent;
          uVar67 = (long)p_Var60 - (long)p_Var36;
          if ((ulong)((long)local_280 - (long)local_290._M_nxt) < uVar67) {
            __dest = (_Base_ptr)
                     std::
                     _Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                     ::_M_allocate((_Vector_base<(anonymous_namespace)::JBTIndex,_std::allocator<(anonymous_namespace)::JBTIndex>_>
                                    *)((long)uVar67 >> 2),(size_t)paVar61);
            if (p_Var36 != p_Var60) {
              memcpy(__dest,p_Var36,uVar67 & 0xfffffffffffffffc);
            }
            if ((_Base_ptr)local_290._M_nxt != (_Base_ptr)0x0) {
              operator_delete(local_290._M_nxt,(long)local_280 - (long)local_290._M_nxt);
            }
            local_280 = (pointer)((long)__dest + uVar67);
            local_290._M_nxt = (_Hash_node_base *)__dest;
          }
          else {
            __n = (long)local_288 - (long)local_290._M_nxt;
            if (__n < uVar67) {
              if (local_288 != (_Base_ptr)local_290._M_nxt) {
                memmove(local_290._M_nxt,p_Var36,__n);
                p_Var36 = *(_Base_ptr *)(iVar37._M_node + 5);
                p_Var60 = iVar37._M_node[5]._M_parent;
                __n = (long)local_288 - (long)local_290._M_nxt;
              }
              for (p_Var36 = (_Base_ptr)((long)&p_Var36->_M_color + __n); p_Var36 != p_Var60;
                  p_Var36 = (_Base_ptr)&p_Var36->field_0x4) {
                local_288->_M_color = p_Var36->_M_color;
                local_288 = (_Base_ptr)&local_288->field_0x4;
              }
            }
            else if (p_Var60 != p_Var36) {
              memmove(local_290._M_nxt,p_Var36,uVar67);
            }
          }
          local_288 = (_Base_ptr)((long)local_290._M_nxt + uVar67);
        }
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::reserve(&local_278,
                  (*(long *)((long)&(p_Var13->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 0x80) -
                   *(long *)((long)&(p_Var13->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 0x78) >> 3) * -0x3333333333333333 +
                  (*(long *)(iVar37._M_node + 6) - (long)iVar37._M_node[5]._M_right >> 3) *
                  -0x3333333333333333);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&local_278,
                   (const_iterator)
                   local_278.
                   super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)iVar37._M_node[5]._M_right,
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)(iVar37._M_node + 6));
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&local_278,
                   (const_iterator)
                   local_278.
                   super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)((long)&(p_Var13->
                                super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                ._M_storage._M_storage + 0x78),
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)((long)&(p_Var13->
                                super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                ._M_storage._M_storage + 0x80));
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
        ::reserve(&local_230,
                  ((long)iVar37._M_node[8]._M_parent - *(long *)(iVar37._M_node + 8) >> 4) *
                  -0x5555555555555555 +
                  (*(long *)((long)&(p_Var13->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 200) -
                   *(long *)((long)&(p_Var13->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 0xc0) >> 4) * -0x5555555555555555);
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&local_230,
                   (const_iterator)
                   local_230.
                   super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   *(IncludeEntry **)
                    ((long)&(p_Var13->
                            super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                            ._M_storage._M_storage + 0xc0),
                   *(IncludeEntry **)
                    ((long)&(p_Var13->
                            super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                            ._M_storage._M_storage + 200));
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&local_230,
                   (const_iterator)
                   local_230.
                   super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish,*(IncludeEntry **)(iVar37._M_node + 8)
                   ,(IncludeEntry *)iVar37._M_node[8]._M_parent);
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
        ::reserve(&local_218,
                  (*(long *)(iVar37._M_node + 9) - (long)iVar37._M_node[8]._M_right >> 4) *
                  -0x5555555555555555 +
                  (*(long *)((long)&(p_Var13->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 0xe0) -
                   *(long *)((long)&(p_Var13->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 0xd8) >> 4) * -0x5555555555555555);
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&local_218,
                   (const_iterator)
                   local_218.
                   super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   *(IncludeEntry **)
                    ((long)&(p_Var13->
                            super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                            ._M_storage._M_storage + 0xd8),
                   *(IncludeEntry **)
                    ((long)&(p_Var13->
                            super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                            ._M_storage._M_storage + 0xe0));
        std::
        vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CompileData::IncludeEntry_const*,std::vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>>,void>
                  ((vector<(anonymous_namespace)::CompileData::IncludeEntry,std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
                    *)&local_218,
                   (const_iterator)
                   local_218.
                   super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (IncludeEntry *)iVar37._M_node[8]._M_right,*(IncludeEntry **)(iVar37._M_node + 9)
                  );
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::reserve(&local_260,
                  (*(long *)((long)&(p_Var13->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 0x98) -
                   *(long *)((long)&(p_Var13->
                                    super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                    ._M_storage._M_storage + 0x90) >> 3) * -0x3333333333333333 +
                  ((long)iVar37._M_node[6]._M_right - (long)iVar37._M_node[6]._M_left >> 3) *
                  -0x3333333333333333);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&local_260,
                   (const_iterator)
                   local_260.
                   super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)iVar37._M_node[6]._M_left,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)iVar37._M_node[6]._M_right);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::
        insert<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>const*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,void>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&local_260,
                   (const_iterator)
                   local_260.
                   super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)((long)&(p_Var13->
                                super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                ._M_storage._M_storage + 0x90),
                   *(JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)((long)&(p_Var13->
                                super__Hash_node_value<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>
                                ._M_storage._M_storage + 0x98));
        pJVar74 = local_260.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pJVar66 = local_260.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pJVar52 = local_260.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_260.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_260.
            super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar53 = ((long)local_260.
                          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_260.
                          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
          p._M_dataplus._M_p = (pointer)((lVar53 - (lVar53 + 1 >> 0x3f)) + 1 >> 1);
          pJVar70 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&p._M_string_length;
          p._M_string_length = 0;
          p.field_2._M_allocated_capacity = 0;
          pJVar52 = pJVar70;
          pJVar49 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)p._M_dataplus._M_p;
          if (0 < (long)local_260.
                        super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_260.
                        super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
LAB_004541ef:
            pJVar52 = pJVar49;
            pJVar49 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)operator_new((long)pJVar52 * 0x28,(nothrow_t *)&std::nothrow);
            if (pJVar49 ==
                (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) goto code_r0x00454208;
            if (pJVar52 !=
                (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
              paVar61 = &(pJVar49->Value).field_2;
              (pJVar49->Value)._M_dataplus._M_p = (pointer)paVar61;
              pcVar62 = (pJVar66->Value)._M_dataplus._M_p;
              paVar68 = &(pJVar66->Value).field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar62 == paVar68) {
                uVar45 = *(undefined8 *)((long)&(pJVar66->Value).field_2 + 8);
                paVar61->_M_allocated_capacity = paVar68->_M_allocated_capacity;
                *(undefined8 *)((long)&(pJVar49->Value).field_2 + 8) = uVar45;
              }
              else {
                (pJVar49->Value)._M_dataplus._M_p = pcVar62;
                (pJVar49->Value).field_2._M_allocated_capacity = paVar68->_M_allocated_capacity;
              }
              (pJVar49->Value)._M_string_length = (pJVar66->Value)._M_string_length;
              (pJVar66->Value)._M_dataplus._M_p = (pointer)paVar68;
              (pJVar66->Value)._M_string_length = 0;
              (pJVar66->Value).field_2._M_local_buf[0] = '\0';
              (pJVar49->Backtrace).Index = (pJVar66->Backtrace).Index;
              pJVar70 = pJVar49;
              if (pJVar52 !=
                  (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x1) {
                lVar53 = (long)pJVar52 * 0x28 + -0x28;
                paVar61 = &pJVar49[1].Value.field_2;
                do {
                  paVar68 = paVar61;
                  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (paVar68 + -1))->_M_dataplus)._M_p = (pointer)paVar68;
                  psVar2 = (size_type *)((long)paVar68 + -0x28);
                  if (psVar2 == *(size_type **)((long)paVar68 + -0x38)) {
                    paVar68->_M_allocated_capacity = *psVar2;
                    *(size_type *)((long)paVar68 + 8) = paVar68[-2]._M_allocated_capacity;
                  }
                  else {
                    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (paVar68 + -1))->_M_dataplus)._M_p =
                         (pointer)*(size_type **)((long)paVar68 + -0x38);
                    paVar68->_M_allocated_capacity = *(size_type *)((long)paVar68 + -0x28);
                  }
                  *(size_type *)((long)paVar68 + -8) = paVar68[-3]._M_allocated_capacity;
                  *(size_type **)((long)paVar68 + -0x38) = psVar2;
                  paVar68[-3]._M_allocated_capacity = 0;
                  *(undefined1 *)((long)paVar68 + -0x28) = 0;
                  *(undefined4 *)(paVar68 + 1) = *(undefined4 *)((long)paVar68 + -0x18);
                  lVar53 = lVar53 + -0x28;
                  paVar61 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((long)paVar68 + 0x28);
                } while (lVar53 != 0);
                pJVar70 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(paVar68 + -1);
              }
              std::__cxx11::string::operator=((string *)pJVar66,(string *)pJVar70);
              (pJVar66->Backtrace).Index = (pJVar70->Backtrace).Index;
            }
            p._M_string_length = (size_type)pJVar52;
            p.field_2._M_allocated_capacity = (size_type)pJVar49;
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,(anonymous_namespace)::JBT<std::__cxx11::string>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)((anonymous_namespace)::JBT<std::__cxx11::string>const&,(anonymous_namespace)::JBT<std::__cxx11::string>const&)>>
                      ((__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )pJVar66,
                       (__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )pJVar74,pJVar49,(long)pJVar52,
                       (_Iter_comp_iter<bool_(*)(const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                        )0x45be1c);
            goto LAB_00454334;
          }
LAB_00454218:
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::string>*,std::vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)((anonymous_namespace)::JBT<std::__cxx11::string>const&,(anonymous_namespace)::JBT<std::__cxx11::string>const&)>>
                    ((__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      )pJVar66,
                     (__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      )pJVar74,
                     (_Iter_comp_iter<bool_(*)(const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                      )0x45be1c);
LAB_00454334:
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&p);
          pJVar66 = local_260.
                    super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pJVar70 = local_260.
                    super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pJVar74 = local_260.
                    super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (local_260.
              super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_260.
              super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              pJVar49 = pJVar70;
              pJVar70 = pJVar49 + 1;
              pJVar74 = local_260.
                        super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (pJVar70 == pJVar66) goto LAB_004543f1;
              bVar24 = JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::ValueEq(pJVar49,pJVar70);
            } while (!bVar24);
            pJVar70 = pJVar49 + 2;
            pJVar69 = pJVar66;
            for (; pJVar70 != pJVar66; pJVar70 = pJVar70 + 1) {
              bVar24 = JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::ValueEq(pJVar49,pJVar70);
              pJVar69 = pJVar49;
              if (!bVar24) {
                pJVar69 = pJVar49 + 1;
                std::__cxx11::string::operator=((string *)pJVar69,(string *)pJVar70);
                pJVar49[1].Backtrace.Index = (pJVar70->Backtrace).Index;
              }
              pJVar49 = pJVar69;
              pJVar69 = local_260.
                        super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            pJVar74 = local_260.
                      super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pJVar49 + 1 != pJVar69) {
              paVar61 = &pJVar49[1].Value.field_2;
              do {
                if (paVar61 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*(long **)(paVar61->_M_local_buf + -0x10)) {
                  operator_delete(*(long **)(paVar61->_M_local_buf + -0x10),
                                  paVar61->_M_allocated_capacity + 1);
                }
                pJVar70 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(paVar61->_M_local_buf + 0x18);
                paVar61 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar61->_M_local_buf + 0x28);
                pJVar74 = pJVar49 + 1;
              } while (pJVar70 != pJVar69);
            }
          }
        }
      }
LAB_004543f1:
      local_260.
      super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pJVar74;
      Json::Value::Value((Value *)&installGens,objectValue);
      if (artifact._8_8_ != 0) {
        Json::Value::Value((Value *)&p,(String *)&artifact);
        pVVar29 = Json::Value::operator[]((Value *)&installGens,"language");
        Json::Value::operator=(pVVar29,(Value *)&p);
        Json::Value::~Value((Value *)&p);
      }
      if (local_278.
          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_278.
          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        Json::Value::Value((Value *)&obj_dir,arrayValue);
        pJVar74 = local_278.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pTVar71 = (Target *)
                       local_278.
                       super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pTVar71 != (Target *)pJVar74;
            pTVar71 = (Target *)((pTVar71->TopSource).field_2._M_local_buf + 8)) {
          local_320 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x0;
          local_318._M_allocated_capacity = local_318._M_allocated_capacity & 0xffffffffffffff00;
          __dnew = (size_type)&local_318;
          DumpCommandFragment((Value *)&p,pTVar71,
                              (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&__dnew,&pJVar52->Value);
          Json::Value::append((Value *)&obj_dir,(Value *)&p);
          Json::Value::~Value((Value *)&p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__dnew != &local_318) {
            operator_delete((void *)__dnew,local_318._M_allocated_capacity + 1);
          }
        }
        pVVar29 = Json::Value::operator[]((Value *)&installGens,"compileCommandFragments");
        Json::Value::operator=(pVVar29,(Value *)&obj_dir);
        Json::Value::~Value((Value *)&obj_dir);
      }
      if (local_230.
          super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_230.
          super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        Json::Value::Value((Value *)&p,arrayValue);
        pIVar20 = local_230.
                  super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pIVar54 = extraout_RDX_03;
        for (pTVar71 = (Target *)
                       local_230.
                       super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start; pTVar71 != (Target *)pIVar20;
            pTVar71 = (Target *)&pTVar71->TopBuild) {
          DumpInclude((Value *)&obj_dir,pTVar71,pIVar54);
          Json::Value::append((Value *)&p,(Value *)&obj_dir);
          Json::Value::~Value((Value *)&obj_dir);
          pIVar54 = extraout_RDX_04;
        }
        pVVar29 = Json::Value::operator[]((Value *)&installGens,"includes");
        Json::Value::operator=(pVVar29,(Value *)&p);
        Json::Value::~Value((Value *)&p);
      }
      if (local_218.
          super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_218.
          super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        Json::Value::Value((Value *)&p,arrayValue);
        pIVar20 = local_218.
                  super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pIVar54 = extraout_RDX_05;
        for (pTVar71 = (Target *)
                       local_218.
                       super__Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start; pTVar71 != (Target *)pIVar20;
            pTVar71 = (Target *)&pTVar71->TopBuild) {
          DumpInclude((Value *)&obj_dir,pTVar71,pIVar54);
          Json::Value::append((Value *)&p,(Value *)&obj_dir);
          Json::Value::~Value((Value *)&obj_dir);
          pIVar54 = extraout_RDX_06;
        }
        pVVar29 = Json::Value::operator[]((Value *)&installGens,"frameworks");
        Json::Value::operator=(pVVar29,(Value *)&p);
        Json::Value::~Value((Value *)&p);
      }
      if (local_260.
          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_260.
          super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        Json::Value::Value((Value *)&obj_dir,arrayValue);
        pJVar74 = local_260.
                  super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pJVar52 = local_260.
                       super__Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pJVar52 != pJVar74;
            pJVar52 = pJVar52 + 1) {
          Json::Value::Value((Value *)&__dnew,objectValue);
          Json::Value::Value((Value *)&p,&pJVar52->Value);
          pVVar29 = Json::Value::operator[]((Value *)&__dnew,"define");
          Json::Value::operator=(pVVar29,(Value *)&p);
          Json::Value::~Value((Value *)&p);
          AddBacktrace((Target *)&__dnew,(Value *)(ulong)(pJVar52->Backtrace).Index,bt);
          Json::Value::append((Value *)&obj_dir,(Value *)&__dnew);
          Json::Value::~Value((Value *)&__dnew);
        }
        pVVar29 = Json::Value::operator[]((Value *)&installGens,"defines");
        Json::Value::operator=(pVVar29,(Value *)&obj_dir);
        Json::Value::~Value((Value *)&obj_dir);
      }
      if (local_248 != local_240) {
        Json::Value::Value((Value *)&obj_dir,arrayValue);
        pJVar66 = local_240;
        for (pJVar74 = local_248; pJVar74 != pJVar66; pJVar74 = pJVar74 + 1) {
          Json::Value::Value((Value *)&__dnew,objectValue);
          Json::Value::Value((Value *)&p,&pJVar74->Value);
          pVVar29 = Json::Value::operator[]((Value *)&__dnew,"header");
          Json::Value::operator=(pVVar29,(Value *)&p);
          Json::Value::~Value((Value *)&p);
          AddBacktrace((Target *)&__dnew,(Value *)(ulong)(pJVar74->Backtrace).Index,bt_00);
          Json::Value::append((Value *)&obj_dir,(Value *)&__dnew);
          Json::Value::~Value((Value *)&__dnew);
        }
        pVVar29 = Json::Value::operator[]((Value *)&installGens,"precompileHeaders");
        Json::Value::operator=(pVVar29,(Value *)&obj_dir);
        Json::Value::~Value((Value *)&obj_dir);
      }
      if (local_2b0._8_8_ != 0) {
        Json::Value::Value((Value *)&__dnew,objectValue);
        Json::Value::Value((Value *)&p,(String *)&local_2b0);
        pVVar29 = Json::Value::operator[]((Value *)&__dnew,"standard");
        Json::Value::operator=(pVVar29,(Value *)&p);
        Json::Value::~Value((Value *)&p);
        if ((_Base_ptr)local_290._M_nxt != local_288) {
          Json::Value::Value((Value *)&p,arrayValue);
          p_Var36 = local_288;
          for (_Var72._M_nxt = local_290._M_nxt; (_Base_ptr)_Var72._M_nxt != p_Var36;
              _Var72._M_nxt = (_Hash_node_base *)&(_Var72._M_nxt)->_M_nxt) {
            Json::Value::Value((Value *)&obj_dir,((_Base_ptr)_Var72._M_nxt)->_M_color);
            Json::Value::append((Value *)&p,(Value *)&obj_dir);
            Json::Value::~Value((Value *)&obj_dir);
          }
          pVVar29 = Json::Value::operator[]((Value *)&__dnew,"backtraces");
          Json::Value::operator=(pVVar29,(Value *)&p);
          Json::Value::~Value((Value *)&p);
        }
        pVVar29 = Json::Value::operator[]((Value *)&installGens,"languageStandard");
        Json::Value::operator=(pVVar29,(Value *)&__dnew);
        Json::Value::~Value((Value *)&__dnew);
      }
      CompileData::~CompileData((CompileData *)&artifact);
      pVVar29 = Json::Value::operator[]((Value *)&installGens,"sourceIndexes");
      Json::Value::operator=(pVVar29,&pCVar59->SourceIndexes);
      Json::Value::append(&compileGroups,(Value *)&installGens);
      Json::Value::~Value((Value *)&installGens);
      pCVar59 = pCVar59 + 1;
    } while ((BacktraceData *)pCVar59 != local_138);
  }
  bVar24 = Json::Value::empty(&compileGroups);
  if (!bVar24) {
    pVVar29 = Json::Value::operator[](__return_storage_ptr__,"compileGroups");
    Json::Value::operator=(pVVar29,&compileGroups);
  }
  Json::Value::~Value(&compileGroups);
  Json::Value::~Value(&sourceGroups);
  Json::Value::~Value(&folder);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)local_178);
  Json::Value::~Value(&launchers);
  BacktraceData::Dump(&artifact,&this->Backtraces);
  pVVar29 = Json::Value::operator[](__return_storage_ptr__,"backtraceGraph");
  Json::Value::operator=(pVVar29,&artifact);
  Json::Value::~Value(&artifact);
  Json::Value::~Value(&dependencies);
  return extraout_RAX;
code_r0x00454208:
  pbVar18 = &pJVar52->Value;
  bVar24 = pJVar52 < (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x2;
  pJVar52 = pJVar70;
  pJVar49 = (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
            )((ulong)((long)&(pbVar18->_M_dataplus)._M_p + 1U) >> 1);
  if (bVar24) goto LAB_00454218;
  goto LAB_004541ef;
}

Assistant:

Json::Value Target::Dump()
{
  Json::Value target = Json::objectValue;

  cmStateEnums::TargetType const type = this->GT->GetType();

  target["name"] = this->GT->GetName();
  target["type"] = cmState::GetTargetTypeName(type);
  target["id"] = TargetId(this->GT, this->TopBuild);
  target["paths"] = this->DumpPaths();
  if (this->GT->Target->GetIsGeneratorProvided()) {
    target["isGeneratorProvided"] = true;
  }

  this->AddBacktrace(target, this->GT->GetBacktrace());

  if (this->GT->Target->GetHaveInstallRule()) {
    target["install"] = this->DumpInstall();
  }

  if (this->GT->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = this->DumpArtifacts();
    if (!artifacts.empty()) {
      target["artifacts"] = std::move(artifacts);
    }
  }

  if (type == cmStateEnums::EXECUTABLE ||
      type == cmStateEnums::SHARED_LIBRARY ||
      type == cmStateEnums::MODULE_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["link"] = this->DumpLink();
  } else if (type == cmStateEnums::STATIC_LIBRARY) {
    target["nameOnDisk"] = this->GT->GetFullName(this->Config);
    target["archive"] = this->DumpArchive();
  }

  if (type == cmStateEnums::EXECUTABLE) {
    Json::Value launchers = this->DumpLaunchers();
    if (!launchers.empty()) {
      target["launchers"] = std::move(launchers);
    }
  }

  Json::Value dependencies = this->DumpDependencies();
  if (!dependencies.empty()) {
    target["dependencies"] = dependencies;
  }

  {
    this->ProcessLanguages();

    auto fileSetInfo = this->DumpFileSets();

    if (!fileSetInfo.first.isNull()) {
      target["fileSets"] = fileSetInfo.first;
    }

    target["sources"] = this->DumpSources(fileSetInfo.second);

    Json::Value folder = this->DumpFolder();
    if (!folder.isNull()) {
      target["folder"] = std::move(folder);
    }

    Json::Value sourceGroups = this->DumpSourceGroups();
    if (!sourceGroups.empty()) {
      target["sourceGroups"] = std::move(sourceGroups);
    }

    Json::Value compileGroups = this->DumpCompileGroups();
    if (!compileGroups.empty()) {
      target["compileGroups"] = std::move(compileGroups);
    }
  }

  target["backtraceGraph"] = this->Backtraces.Dump();

  return target;
}